

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Colour.cpp
# Opt level: O0

void __thiscall Colour::Colour(Colour *this,string *name,float r,float g,float b)

{
  GLfloat *pGVar1;
  float b_local;
  float g_local;
  float r_local;
  string *name_local;
  Colour *this_local;
  
  std::__cxx11::string::string((string *)&this->name);
  this->r = (int)(r * 255.0);
  this->g = (int)(g * 255.0);
  this->b = (int)(b * 255.0);
  pGVar1 = (GLfloat *)operator_new__(0xc);
  this->colour = pGVar1;
  *this->colour = r;
  this->colour[1] = g;
  this->colour[2] = b;
  std::__cxx11::string::operator=((string *)&this->name,(string *)name);
  return;
}

Assistant:

Colour::Colour(const string& name, float r, float g, float b) {
    this->r = r*255;
    this->g = g*255;
    this->b = b*255;
    
    colour = new GLfloat[3];
    this->colour[0] = r;
    this->colour[1] = g;
    this->colour[2] = b;

    this->name = name;
}